

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

int __thiscall
btSoftBody::rayTest(btSoftBody *this,btVector3 *rayFrom,btVector3 *rayTo,btScalar *mint,_ *feature,
                   int *index,bool bcountonly)

{
  btDbvtNode *root;
  Face *pFVar1;
  Tetra *pTVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  btScalar bVar8;
  float fVar9;
  float fVar10;
  btVector3 dir;
  btVector3 v2;
  btVector3 v1;
  RayFromToCaster collider;
  btVector3 local_b8;
  btVector3 local_a8;
  btVector3 local_98;
  btVector3 local_88;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined1 local_60 [16];
  btScalar local_50;
  long local_48;
  undefined4 local_40;
  
  fVar7 = (float)*(undefined8 *)rayTo->m_floats - (float)*(undefined8 *)rayFrom->m_floats;
  fVar9 = (float)((ulong)*(undefined8 *)rayTo->m_floats >> 0x20) -
          (float)((ulong)*(undefined8 *)rayFrom->m_floats >> 0x20);
  fVar10 = rayTo->m_floats[2] - rayFrom->m_floats[2];
  local_b8.m_floats[1] = fVar9;
  local_b8.m_floats[0] = fVar7;
  local_b8.m_floats[2] = fVar10;
  local_b8.m_floats[3] = 0.0;
  if ((bcountonly) || (root = (this->m_fdbvt).m_root, root == (btDbvtNode *)0x0)) {
    lVar3 = (long)(this->m_faces).m_size;
    if (0 < lVar3) {
      lVar5 = 0;
      lVar6 = 0x20;
      iVar4 = 0;
      do {
        pFVar1 = (this->m_faces).m_data;
        bVar8 = RayFromToCaster::rayFromToTriangle
                          (rayFrom,rayTo,&local_b8,
                           (btVector3 *)(*(long *)((long)pFVar1->m_n + lVar6 + -0x20) + 0x10),
                           (btVector3 *)(*(long *)((long)pFVar1->m_n + lVar6 + -0x18) + 0x10),
                           (btVector3 *)(*(long *)((long)pFVar1->m_n + lVar6 + -0x10) + 0x10),*mint)
        ;
        if ((0.0 < bVar8) && (iVar4 = iVar4 + 1, !bcountonly)) {
          *feature = Face;
          *index = (int)lVar5;
          *mint = bVar8;
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x48;
      } while (lVar3 != lVar5);
      goto LAB_001dc06a;
    }
  }
  else {
    local_50 = *mint;
    local_88.m_floats._0_8_ = &PTR__ICollide_00221358;
    local_88.m_floats._8_8_ = *(undefined8 *)rayFrom->m_floats;
    uStack_78 = *(undefined8 *)(rayFrom->m_floats + 2);
    local_60._4_4_ = fVar9;
    local_60._0_4_ = fVar7;
    local_60._8_4_ = fVar10;
    local_60._12_4_ = 0;
    local_70 = *(undefined8 *)rayTo->m_floats;
    uStack_68 = *(undefined8 *)(rayTo->m_floats + 2);
    local_48 = 0;
    local_40 = 0;
    btDbvt::rayTest(root,rayFrom,rayTo,(ICollide *)&local_88);
    if (local_48 != 0) {
      *mint = local_50;
      *feature = Face;
      *index = (int)((ulong)(local_48 - (long)(this->m_faces).m_data) >> 3) * 0x38e38e39;
      iVar4 = 1;
      goto LAB_001dc06a;
    }
  }
  iVar4 = 0;
LAB_001dc06a:
  if (0 < (this->m_tetras).m_size) {
    lVar3 = 0;
    do {
      lVar5 = 8;
      pTVar2 = (this->m_tetras).m_data;
      do {
        local_88.m_floats._0_8_ =
             *(undefined8 *)(pTVar2[lVar3].m_n[*(int *)(&DAT_001f25d8 + lVar5)]->m_x).m_floats;
        local_88.m_floats._8_8_ =
             *(undefined8 *)((pTVar2[lVar3].m_n[*(int *)(&DAT_001f25d8 + lVar5)]->m_x).m_floats + 2)
        ;
        local_98.m_floats._0_8_ =
             *(undefined8 *)(pTVar2[lVar3].m_n[*(int *)((long)&DAT_001f25dc + lVar5)]->m_x).m_floats
        ;
        local_98.m_floats._8_8_ =
             *(undefined8 *)
              ((pTVar2[lVar3].m_n[*(int *)((long)&DAT_001f25dc + lVar5)]->m_x).m_floats + 2);
        local_a8.m_floats._0_8_ =
             *(undefined8 *)(pTVar2[lVar3].m_n[*(int *)((long)&DAT_001f25e0 + lVar5)]->m_x).m_floats
        ;
        local_a8.m_floats._8_8_ =
             *(undefined8 *)
              ((pTVar2[lVar3].m_n[*(int *)((long)&DAT_001f25e0 + lVar5)]->m_x).m_floats + 2);
        bVar8 = RayFromToCaster::rayFromToTriangle
                          (rayFrom,rayTo,&local_b8,&local_88,&local_98,&local_a8,*mint);
        if ((0.0 < bVar8) && (iVar4 = iVar4 + 1, !bcountonly)) {
          *feature = Tetra;
          *index = (int)lVar3;
          *mint = bVar8;
        }
        lVar5 = lVar5 + 0xc;
      } while (lVar5 != 0x38);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->m_tetras).m_size);
  }
  return iVar4;
}

Assistant:

int					btSoftBody::rayTest(const btVector3& rayFrom,const btVector3& rayTo,
										btScalar& mint,eFeature::_& feature,int& index,bool bcountonly) const
{
	int	cnt=0;
	btVector3 dir = rayTo-rayFrom;
	

	if(bcountonly||m_fdbvt.empty())
	{/* Full search	*/ 
		
		for(int i=0,ni=m_faces.size();i<ni;++i)
		{
			const btSoftBody::Face&	f=m_faces[i];

			const btScalar			t=RayFromToCaster::rayFromToTriangle(	rayFrom,rayTo,dir,
				f.m_n[0]->m_x,
				f.m_n[1]->m_x,
				f.m_n[2]->m_x,
				mint);
			if(t>0)
			{
				++cnt;
				if(!bcountonly)
				{
					feature=btSoftBody::eFeature::Face;
					index=i;
					mint=t;
				}
			}
		}
	}
	else
	{/* Use dbvt	*/ 
		RayFromToCaster	collider(rayFrom,rayTo,mint);

		btDbvt::rayTest(m_fdbvt.m_root,rayFrom,rayTo,collider);
		if(collider.m_face)
		{
			mint=collider.m_mint;
			feature=btSoftBody::eFeature::Face;
			index=(int)(collider.m_face-&m_faces[0]);
			cnt=1;
		}
	}

	for (int i=0;i<m_tetras.size();i++)
	{
		const btSoftBody::Tetra& tet = m_tetras[i];
		int tetfaces[4][3] = {{0,1,2},{0,1,3},{1,2,3},{0,2,3}};
		for (int f=0;f<4;f++)
		{

			int index0=tetfaces[f][0];
			int index1=tetfaces[f][1];
			int index2=tetfaces[f][2];
			btVector3 v0=tet.m_n[index0]->m_x;
			btVector3 v1=tet.m_n[index1]->m_x;
			btVector3 v2=tet.m_n[index2]->m_x;


		const btScalar			t=RayFromToCaster::rayFromToTriangle(	rayFrom,rayTo,dir,
			v0,v1,v2,
				mint);
		if(t>0)
			{
				++cnt;
				if(!bcountonly)
				{
					feature=btSoftBody::eFeature::Tetra;
					index=i;
					mint=t;
				}
			}
		}
	}
	return(cnt);
}